

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper1.cpp
# Opt level: O0

void cpp_wrapper_insert(planck_unit_test_t *tc,Dictionary<int,_int> *dict,int key,int value,
                       ion_boolean_t check_result)

{
  planck_unit_result_t pVar1;
  ion_status_t iVar2;
  char local_2c;
  int32_t iStack_28;
  ion_status_t status;
  ion_boolean_t check_result_local;
  int value_local;
  int key_local;
  Dictionary<int,_int> *dict_local;
  planck_unit_test_t *tc_local;
  
  iVar2 = Dictionary<int,_int>::insert(dict,key,value);
  local_2c = iVar2.error;
  pVar1 = planck_unit_assert_int_are_equal
                    (tc,0,(int)local_2c,0xf5,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test1/test_cpp_wrapper1.cpp"
                    );
  if (pVar1 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  iStack_28 = iVar2.count;
  pVar1 = planck_unit_assert_int_are_equal
                    (tc,1,iStack_28,0xf6,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test1/test_cpp_wrapper1.cpp"
                    );
  if (pVar1 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  if (check_result != '\0') {
    cpp_wrapper_get(tc,dict,key,value,'\0',1);
  }
  return;
}

Assistant:

void
cpp_wrapper_insert(
	planck_unit_test_t *tc,
	Dictionary<int, int>	*dict,
	int key,
	int value,
	ion_boolean_t check_result
) {
	ion_status_t status = dict->insert(key, value);

	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, err_ok, status.error);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, 1, status.count);

	if (check_result) {
		cpp_wrapper_get(tc, dict, key, value, err_ok, 1);
	}
}